

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<ArgumentDef>::copyAppend
          (QGenericArrayOps<ArgumentDef> *this,ArgumentDef *b,ArgumentDef *e)

{
  ArgumentDef *pAVar1;
  Data *pDVar2;
  TypeTags TVar3;
  Token TVar4;
  ReferenceType RVar5;
  long lVar6;
  
  if ((b != e) && (b < e)) {
    pAVar1 = (this->super_QArrayDataPointer<ArgumentDef>).ptr;
    lVar6 = (this->super_QArrayDataPointer<ArgumentDef>).size;
    do {
      pDVar2 = (b->type).name.d.d;
      pAVar1[lVar6].type.name.d.d = pDVar2;
      pAVar1[lVar6].type.name.d.ptr = (b->type).name.d.ptr;
      pAVar1[lVar6].type.name.d.size = (b->type).name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar2 = (b->type).rawName.d.d;
      pAVar1[lVar6].type.rawName.d.d = pDVar2;
      pAVar1[lVar6].type.rawName.d.ptr = (b->type).rawName.d.ptr;
      pAVar1[lVar6].type.rawName.d.size = (b->type).rawName.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      TVar3.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (b->type).typeTag.super_QFlagsStorageHelper<TypeTag,_4>;
      TVar4 = (b->type).firstToken;
      RVar5 = (b->type).referenceType;
      *(undefined4 *)&pAVar1[lVar6].type.field_0x30 = *(undefined4 *)&(b->type).field_0x30;
      pAVar1[lVar6].type.typeTag =
           (TypeTags)TVar3.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i;
      pAVar1[lVar6].type.firstToken = TVar4;
      pAVar1[lVar6].type.referenceType = RVar5;
      pDVar2 = (b->rightType).d.d;
      pAVar1[lVar6].rightType.d.d = pDVar2;
      pAVar1[lVar6].rightType.d.ptr = (b->rightType).d.ptr;
      pAVar1[lVar6].rightType.d.size = (b->rightType).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->normalizedType).d.d;
      pAVar1[lVar6].normalizedType.d.d = pDVar2;
      pAVar1[lVar6].normalizedType.d.ptr = (b->normalizedType).d.ptr;
      pAVar1[lVar6].normalizedType.d.size = (b->normalizedType).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->name).d.d;
      pAVar1[lVar6].name.d.d = pDVar2;
      pAVar1[lVar6].name.d.ptr = (b->name).d.ptr;
      pAVar1[lVar6].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->typeNameForCast).d.d;
      pAVar1[lVar6].typeNameForCast.d.d = pDVar2;
      pAVar1[lVar6].typeNameForCast.d.ptr = (b->typeNameForCast).d.ptr;
      pAVar1[lVar6].typeNameForCast.d.size = (b->typeNameForCast).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pAVar1[lVar6].isDefault = b->isDefault;
      b = b + 1;
      lVar6 = (this->super_QArrayDataPointer<ArgumentDef>).size + 1;
      (this->super_QArrayDataPointer<ArgumentDef>).size = lVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }